

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_16x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  unkuint9 Var10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [13];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  short sVar17;
  short sVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  short sVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  short sVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  short sVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  short sVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  short sVar65;
  short sVar67;
  undefined1 in_XMM5 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM6 [16];
  
  auVar15 = pshuflw(ZEXT116(left_column[3]),ZEXT116(left_column[3]),0);
  auVar18._0_2_ = auVar15._0_2_;
  sVar17 = auVar15._2_2_;
  auVar18._2_2_ = sVar17 * 0x6b;
  auVar18._4_2_ = auVar18._0_2_ * 0xab;
  auVar18._6_2_ = sVar17 * 0xc0;
  auVar18._8_2_ = auVar18._0_2_ * 0x100;
  auVar18._10_2_ = sVar17 * 0x100;
  auVar18._12_2_ = auVar18._0_2_ * 0x100;
  auVar18._14_2_ = sVar17 * 0x100;
  auVar15 = *(undefined1 (*) [16])top_row;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar15._0_13_;
  auVar3[0xe] = auVar15[7];
  auVar4[0xc] = auVar15[6];
  auVar4._0_12_ = auVar15._0_12_;
  auVar4._13_2_ = auVar3._13_2_;
  auVar5[0xb] = 0;
  auVar5._0_11_ = auVar15._0_11_;
  auVar5._12_3_ = auVar4._12_3_;
  auVar6[10] = auVar15[5];
  auVar6._0_10_ = auVar15._0_10_;
  auVar6._11_4_ = auVar5._11_4_;
  auVar7[9] = 0;
  auVar7._0_9_ = auVar15._0_9_;
  auVar7._10_5_ = auVar6._10_5_;
  auVar8[8] = auVar15[4];
  auVar8._0_8_ = auVar15._0_8_;
  auVar8._9_6_ = auVar7._9_6_;
  auVar9._7_8_ = 0;
  auVar9._0_7_ = auVar8._8_7_;
  Var10 = CONCAT81(SUB158(auVar9 << 0x40,7),auVar15[3]);
  auVar13._9_6_ = 0;
  auVar13._0_9_ = Var10;
  auVar11._1_10_ = SUB1510(auVar13 << 0x30,5);
  auVar11[0] = auVar15[2];
  auVar14._11_4_ = 0;
  auVar14._0_11_ = auVar11;
  auVar12._1_12_ = SUB1512(auVar14 << 0x20,3);
  auVar12[0] = auVar15[1];
  auVar16._0_2_ = CONCAT11(0,auVar15[0]);
  auVar16._2_13_ = auVar12;
  auVar16[0xf] = 0;
  auVar19._0_2_ = CONCAT11(0,auVar15[8]);
  auVar19[2] = auVar15[9];
  auVar19[3] = 0;
  auVar19[4] = auVar15[10];
  auVar19[5] = 0;
  auVar19[6] = auVar15[0xb];
  auVar19[7] = 0;
  auVar19[8] = auVar15[0xc];
  auVar19[9] = 0;
  auVar19[10] = auVar15[0xd];
  auVar19[0xb] = 0;
  auVar19[0xc] = auVar15[0xe];
  auVar19[0xd] = 0;
  auVar19[0xe] = auVar15[0xf];
  auVar19[0xf] = 0;
  sVar17 = auVar12._0_2_;
  sVar20 = auVar11._0_2_;
  sVar47 = (short)Var10;
  sVar51 = auVar8._8_2_;
  sVar55 = auVar6._10_2_;
  sVar59 = auVar4._12_2_;
  uVar39 = auVar3._13_2_ >> 8;
  auVar66 = pshuflw(in_XMM5,auVar18,0);
  sVar65 = auVar66._0_2_ + 0x80;
  sVar67 = auVar66._2_2_ + 0x80;
  uVar40 = (ushort)auVar15[9];
  uVar43 = (ushort)auVar15[10];
  uVar46 = (ushort)auVar15[0xb];
  uVar50 = (ushort)auVar15[0xc];
  uVar54 = (ushort)auVar15[0xd];
  uVar58 = (ushort)auVar15[0xe];
  uVar62 = (ushort)auVar15[0xf];
  uVar37 = auVar16._0_2_ * 0xff + sVar65;
  uVar41 = sVar17 * 0xff + sVar67;
  uVar44 = sVar20 * 0xff + sVar65;
  uVar48 = sVar47 * 0xff + sVar67;
  uVar52 = sVar51 * 0xff + sVar65;
  uVar56 = sVar55 * 0xff + sVar67;
  uVar60 = sVar59 * 0xff + sVar65;
  uVar63 = uVar39 * 0xff + sVar67;
  uVar38 = uVar37 >> 8;
  uVar42 = uVar41 >> 8;
  uVar45 = uVar44 >> 8;
  uVar49 = uVar48 >> 8;
  uVar53 = uVar52 >> 8;
  uVar57 = uVar56 >> 8;
  uVar61 = uVar60 >> 8;
  uVar64 = uVar63 >> 8;
  uVar21 = auVar19._0_2_ * 0xff + sVar65;
  uVar23 = uVar40 * 0xff + sVar67;
  uVar25 = uVar43 * 0xff + sVar65;
  uVar27 = uVar46 * 0xff + sVar67;
  uVar29 = uVar50 * 0xff + sVar65;
  uVar31 = uVar54 * 0xff + sVar67;
  uVar33 = uVar58 * 0xff + sVar65;
  uVar35 = uVar62 * 0xff + sVar67;
  uVar22 = uVar21 >> 8;
  uVar24 = uVar23 >> 8;
  uVar26 = uVar25 >> 8;
  uVar28 = uVar27 >> 8;
  uVar30 = uVar29 >> 8;
  uVar32 = uVar31 >> 8;
  uVar34 = uVar33 >> 8;
  uVar36 = uVar35 >> 8;
  *dst = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
  dst[1] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
  dst[2] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
  dst[3] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
  dst[4] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
  dst[5] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
  dst[6] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
  dst[7] = (uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar63 >> 8) - (0xff < uVar64);
  dst[8] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
  dst[9] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
  dst[10] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
  dst[0xb] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
  dst[0xc] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
  dst[0xd] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
  dst[0xe] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
  dst[0xf] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
  auVar15 = pshuflw(in_XMM6,auVar18,0x55);
  sVar65 = auVar15._0_2_ + 0x80;
  sVar67 = auVar15._2_2_ + 0x80;
  auVar15._0_4_ = CONCAT22(sVar67,sVar65);
  auVar15._4_4_ = auVar15._0_4_;
  auVar15._8_4_ = auVar15._0_4_;
  auVar15._12_4_ = auVar15._0_4_;
  uVar37 = auVar16._0_2_ * 0x95 + sVar65;
  uVar41 = sVar17 * 0x95 + sVar67;
  uVar44 = sVar20 * 0x95 + sVar65;
  uVar48 = sVar47 * 0x95 + sVar67;
  uVar52 = sVar51 * 0x95 + sVar65;
  uVar56 = sVar55 * 0x95 + sVar67;
  uVar60 = sVar59 * 0x95 + sVar65;
  uVar63 = uVar39 * 0x95 + sVar67;
  uVar38 = uVar37 >> 8;
  uVar42 = uVar41 >> 8;
  uVar45 = uVar44 >> 8;
  uVar49 = uVar48 >> 8;
  uVar53 = uVar52 >> 8;
  uVar57 = uVar56 >> 8;
  uVar61 = uVar60 >> 8;
  uVar64 = uVar63 >> 8;
  uVar21 = auVar19._0_2_ * 0x95 + sVar65;
  uVar23 = uVar40 * 0x95 + sVar67;
  uVar25 = uVar43 * 0x95 + sVar65;
  uVar27 = uVar46 * 0x95 + sVar67;
  uVar29 = uVar50 * 0x95 + sVar65;
  uVar31 = uVar54 * 0x95 + sVar67;
  uVar33 = uVar58 * 0x95 + sVar65;
  uVar35 = uVar62 * 0x95 + sVar67;
  uVar22 = uVar21 >> 8;
  uVar24 = uVar23 >> 8;
  uVar26 = uVar25 >> 8;
  uVar28 = uVar27 >> 8;
  uVar30 = uVar29 >> 8;
  uVar32 = uVar31 >> 8;
  uVar34 = uVar33 >> 8;
  uVar36 = uVar35 >> 8;
  puVar1 = dst + stride;
  *puVar1 = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
  puVar1[1] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
  puVar1[2] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
  puVar1[3] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
  puVar1[4] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
  puVar1[5] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
  puVar1[6] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
  puVar1[7] = (uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar63 >> 8) - (0xff < uVar64);
  puVar1[8] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
  puVar1[9] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
  puVar1[10] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
  puVar1[0xb] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
  puVar1[0xc] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
  puVar1[0xd] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
  puVar1[0xe] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
  puVar1[0xf] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
  puVar1 = dst + stride * 3;
  auVar15 = pshuflw(auVar15,auVar18,0xaa);
  sVar65 = auVar15._0_2_ + 0x80;
  sVar67 = auVar15._2_2_ + 0x80;
  uVar29 = auVar16._0_2_ * 0x55 + sVar65;
  uVar31 = sVar17 * 0x55 + sVar67;
  uVar33 = sVar20 * 0x55 + sVar65;
  uVar35 = sVar47 * 0x55 + sVar67;
  uVar37 = sVar51 * 0x55 + sVar65;
  uVar41 = sVar55 * 0x55 + sVar67;
  uVar44 = sVar59 * 0x55 + sVar65;
  uVar48 = uVar39 * 0x55 + sVar67;
  uVar30 = uVar29 >> 8;
  uVar32 = uVar31 >> 8;
  uVar34 = uVar33 >> 8;
  uVar36 = uVar35 >> 8;
  uVar38 = uVar37 >> 8;
  uVar42 = uVar41 >> 8;
  uVar45 = uVar44 >> 8;
  uVar49 = uVar48 >> 8;
  uVar39 = auVar19._0_2_ * 0x55 + sVar65;
  uVar21 = uVar40 * 0x55 + sVar67;
  uVar22 = uVar43 * 0x55 + sVar65;
  uVar23 = uVar46 * 0x55 + sVar67;
  uVar24 = uVar50 * 0x55 + sVar65;
  uVar25 = uVar54 * 0x55 + sVar67;
  uVar26 = uVar58 * 0x55 + sVar65;
  uVar27 = uVar62 * 0x55 + sVar67;
  uVar40 = uVar39 >> 8;
  uVar43 = uVar21 >> 8;
  uVar46 = uVar22 >> 8;
  uVar50 = uVar23 >> 8;
  uVar54 = uVar24 >> 8;
  uVar58 = uVar25 >> 8;
  uVar62 = uVar26 >> 8;
  uVar28 = uVar27 >> 8;
  puVar2 = dst + stride * 2;
  *puVar2 = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
  puVar2[1] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
  puVar2[2] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
  puVar2[3] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
  puVar2[4] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
  puVar2[5] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
  puVar2[6] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
  puVar2[7] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
  puVar2[8] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
  puVar2[9] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar43);
  puVar2[10] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar46);
  puVar2[0xb] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar50);
  puVar2[0xc] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar54);
  puVar2[0xd] = (uVar58 != 0) * (uVar58 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar58);
  puVar2[0xe] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar62);
  puVar2[0xf] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
  auVar16 = psllw(auVar16,6);
  auVar15 = psllw(auVar19,6);
  auVar19 = pshuflw(auVar18,auVar18,0xff);
  sVar17 = auVar19._0_2_ + 0x80;
  sVar20 = auVar19._2_2_ + 0x80;
  uVar29 = auVar16._0_2_ + sVar17;
  uVar31 = auVar16._2_2_ + sVar20;
  uVar33 = auVar16._4_2_ + sVar17;
  uVar35 = auVar16._6_2_ + sVar20;
  uVar37 = auVar16._8_2_ + sVar17;
  uVar41 = auVar16._10_2_ + sVar20;
  uVar44 = auVar16._12_2_ + sVar17;
  uVar48 = auVar16._14_2_ + sVar20;
  uVar30 = uVar29 >> 8;
  uVar32 = uVar31 >> 8;
  uVar34 = uVar33 >> 8;
  uVar36 = uVar35 >> 8;
  uVar38 = uVar37 >> 8;
  uVar42 = uVar41 >> 8;
  uVar45 = uVar44 >> 8;
  uVar49 = uVar48 >> 8;
  uVar39 = auVar15._0_2_ + sVar17;
  uVar43 = auVar15._2_2_ + sVar20;
  uVar50 = auVar15._4_2_ + sVar17;
  uVar58 = auVar15._6_2_ + sVar20;
  uVar21 = auVar15._8_2_ + sVar17;
  uVar23 = auVar15._10_2_ + sVar20;
  uVar25 = auVar15._12_2_ + sVar17;
  uVar27 = auVar15._14_2_ + sVar20;
  uVar40 = uVar39 >> 8;
  uVar46 = uVar43 >> 8;
  uVar54 = uVar50 >> 8;
  uVar62 = uVar58 >> 8;
  uVar22 = uVar21 >> 8;
  uVar24 = uVar23 >> 8;
  uVar26 = uVar25 >> 8;
  uVar28 = uVar27 >> 8;
  *puVar1 = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
  puVar1[1] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
  puVar1[2] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
  puVar1[3] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
  puVar1[4] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
  puVar1[5] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
  puVar1[6] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
  puVar1[7] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
  puVar1[8] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
  puVar1[9] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar46);
  puVar1[10] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar54);
  puVar1[0xb] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar62);
  puVar1[0xc] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
  puVar1[0xd] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
  puVar1[0xe] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
  puVar1[0xf] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
  return;
}

Assistant:

void aom_smooth_v_predictor_16x4_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[3]);
  const __m128i weights = cvtepu8_epi16(Load4(smooth_weights));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_bottom_left =
      _mm_mullo_epi16(inverted_weights, bottom_left);
  const __m128i round = _mm_set1_epi16(128);
  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = cvtepu8_epi16(_mm_srli_si128(top, 8));

  __m128i y_select = _mm_set1_epi32(0x01000100);
  __m128i weights_y = _mm_shuffle_epi8(weights, y_select);
  __m128i scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
  dst += stride;
  y_select = _mm_set1_epi32(0x03020302);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
  dst += stride;
  y_select = _mm_set1_epi32(0x05040504);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
  dst += stride;
  y_select = _mm_set1_epi32(0x07060706);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
}